

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

char * cmSHA384_End(SHA_CTX *context,char *buffer)

{
  char *pcVar1;
  int local_54;
  sha_byte **ppsStack_50;
  int i;
  sha_byte *d;
  sha_byte digest [48];
  char *buffer_local;
  SHA_CTX *context_local;
  
  ppsStack_50 = &d;
  digest._40_8_ = buffer;
  if (context != (SHA_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      memset(context,0,0xd0);
    }
    else {
      cmSHA384_Final((sha_byte *)&d,context);
      for (local_54 = 0; local_54 < 0x30; local_54 = local_54 + 1) {
        pcVar1 = (char *)(digest._40_8_ + 1);
        *(char *)digest._40_8_ = sha_hex_digits[(int)(*(byte *)ppsStack_50 & 0xf0) >> 4];
        digest._40_8_ = digest._40_8_ + 2;
        *pcVar1 = sha_hex_digits[(int)(*(byte *)ppsStack_50 & 0xf)];
        ppsStack_50 = (sha_byte **)((long)ppsStack_50 + 1);
      }
      *(undefined1 *)digest._40_8_ = 0;
    }
    memset(&d,0,0x30);
    return (char *)digest._40_8_;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                ,0x635,"char *cmSHA384_End(SHA_CTX *, char *)");
}

Assistant:

char *SHA384_End(SHA_CTX* context, char buffer[]) {
	sha_byte	digest[SHA384_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (buffer != (char*)0) {
		SHA384_Final(digest, context);

		for (i = 0; i < SHA384_DIGEST_LENGTH; i++) {
			*buffer++ = sha_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(*context));
	}
	MEMSET_BZERO(digest, SHA384_DIGEST_LENGTH);
	return buffer;
}